

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

void __thiscall File::~File(File *this)

{
  Tag *this_00;
  pointer ppTVar1;
  uint uVar2;
  pointer ppTVar3;
  ulong uVar4;
  
  this->_vptr_File = (_func_int **)&PTR_load_0010aba8;
  ppTVar3 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar1 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar1 != ppTVar3) {
    uVar2 = 1;
    uVar4 = 0;
    do {
      this_00 = ppTVar3[uVar4];
      if (this_00 != (Tag *)0x0) {
        Tag::~Tag(this_00);
        operator_delete(this_00,0x60);
        (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = (Tag *)0x0;
        ppTVar3 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppTVar1 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar4 < (ulong)((long)ppTVar1 - (long)ppTVar3 >> 3));
  }
  if (ppTVar3 != (pointer)0x0) {
    operator_delete(ppTVar3,(long)(this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar3)
    ;
    return;
  }
  return;
}

Assistant:

File::~File()
{
	for ( unsigned int i = 0; i < _tags.size();i++ )
	{
		if ( _tags[i] != NULL )
		{
			delete _tags[i];
			_tags[i] = NULL;
		}
	}
}